

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O0

void secp256k1_scalar_reduce_512(secp256k1_scalar *r,uint32_t *l)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  uint64_t t_51;
  uint32_t th_51;
  uint32_t tl_51;
  uint over_20;
  uint64_t t_50;
  uint32_t th_50;
  uint32_t tl_50;
  uint64_t t_49;
  uint32_t th_49;
  uint32_t tl_49;
  uint over_19;
  uint over_18;
  uint64_t t_48;
  uint32_t th_48;
  uint32_t tl_48;
  uint64_t t_47;
  uint32_t th_47;
  uint32_t tl_47;
  uint64_t t_46;
  uint32_t th_46;
  uint32_t tl_46;
  uint over_17;
  uint over_16;
  uint64_t t_45;
  uint32_t th_45;
  uint32_t tl_45;
  uint64_t t_44;
  uint32_t th_44;
  uint32_t tl_44;
  uint64_t t_43;
  uint32_t th_43;
  uint32_t tl_43;
  uint64_t t_42;
  uint32_t th_42;
  uint32_t tl_42;
  uint over_15;
  uint64_t t_41;
  uint32_t th_41;
  uint32_t tl_41;
  uint64_t t_40;
  uint32_t th_40;
  uint32_t tl_40;
  uint64_t t_39;
  uint32_t th_39;
  uint32_t tl_39;
  uint64_t t_38;
  uint32_t th_38;
  uint32_t tl_38;
  uint over_14;
  uint64_t t_37;
  uint32_t th_37;
  uint32_t tl_37;
  uint64_t t_36;
  uint32_t th_36;
  uint32_t tl_36;
  uint64_t t_35;
  uint32_t th_35;
  uint32_t tl_35;
  uint over_13;
  uint64_t t_34;
  uint32_t th_34;
  uint32_t tl_34;
  uint64_t t_33;
  uint32_t th_33;
  uint32_t tl_33;
  uint64_t t_32;
  uint32_t th_32;
  uint32_t tl_32;
  uint over_12;
  uint64_t t_31;
  uint32_t th_31;
  uint32_t tl_31;
  uint over_11;
  uint64_t t_30;
  uint32_t th_30;
  uint32_t tl_30;
  uint64_t t_29;
  uint32_t th_29;
  uint32_t tl_29;
  uint over_10;
  uint64_t t_28;
  uint32_t th_28;
  uint32_t tl_28;
  uint64_t t_27;
  uint32_t th_27;
  uint32_t tl_27;
  uint64_t t_26;
  uint32_t th_26;
  uint32_t tl_26;
  uint over_9;
  uint64_t t_25;
  uint32_t th_25;
  uint32_t tl_25;
  uint64_t t_24;
  uint32_t th_24;
  uint32_t tl_24;
  uint64_t t_23;
  uint32_t th_23;
  uint32_t tl_23;
  uint64_t t_22;
  uint32_t th_22;
  uint32_t tl_22;
  uint over_8;
  uint over_7;
  uint64_t t_21;
  uint32_t th_21;
  uint32_t tl_21;
  uint64_t t_20;
  uint32_t th_20;
  uint32_t tl_20;
  uint64_t t_19;
  uint32_t th_19;
  uint32_t tl_19;
  uint64_t t_18;
  uint32_t th_18;
  uint32_t tl_18;
  uint over_6;
  uint over_5;
  uint64_t t_17;
  uint32_t th_17;
  uint32_t tl_17;
  uint64_t t_16;
  uint32_t th_16;
  uint32_t tl_16;
  uint64_t t_15;
  uint32_t th_15;
  uint32_t tl_15;
  uint64_t t_14;
  uint32_t th_14;
  uint32_t tl_14;
  uint over_4;
  uint over_3;
  uint64_t t_13;
  uint32_t th_13;
  uint32_t tl_13;
  uint64_t t_12;
  uint32_t th_12;
  uint32_t tl_12;
  uint64_t t_11;
  uint32_t th_11;
  uint32_t tl_11;
  uint64_t t_10;
  uint32_t th_10;
  uint32_t tl_10;
  uint over_2;
  uint64_t t_9;
  uint32_t th_9;
  uint32_t tl_9;
  uint64_t t_8;
  uint32_t th_8;
  uint32_t tl_8;
  uint64_t t_7;
  uint32_t th_7;
  uint32_t tl_7;
  uint64_t t_6;
  uint32_t th_6;
  uint32_t tl_6;
  uint over_1;
  uint64_t t_5;
  uint32_t th_5;
  uint32_t tl_5;
  uint64_t t_4;
  uint32_t th_4;
  uint32_t tl_4;
  uint64_t t_3;
  uint32_t th_3;
  uint32_t tl_3;
  uint over;
  uint64_t t_2;
  uint32_t th_2;
  uint32_t tl_2;
  uint64_t t_1;
  uint32_t th_1;
  uint32_t tl_1;
  uint64_t t;
  uint32_t th;
  uint32_t tl;
  uint32_t c2;
  uint32_t c1;
  uint32_t c0;
  uint32_t p8;
  uint32_t p7;
  uint32_t p6;
  uint32_t p5;
  uint32_t p4;
  uint32_t p3;
  uint32_t p2;
  uint32_t p1;
  uint32_t p0;
  uint32_t m12;
  uint32_t m11;
  uint32_t m10;
  uint32_t m9;
  uint32_t m8;
  uint32_t m7;
  uint32_t m6;
  uint32_t m5;
  uint32_t m4;
  uint32_t m3;
  uint32_t m2;
  uint32_t m1;
  uint32_t m0;
  uint32_t n7;
  uint32_t n6;
  uint32_t n5;
  uint32_t n4;
  uint32_t n3;
  uint32_t n2;
  uint32_t n1;
  uint32_t n0;
  uint64_t c;
  uint32_t *l_local;
  secp256k1_scalar *r_local;
  
  uVar22 = l[8];
  uVar24 = l[9];
  uVar25 = l[10];
  uVar26 = l[0xb];
  uVar27 = l[0xc];
  uVar28 = l[0xd];
  uVar29 = l[0xe];
  uVar30 = l[0xf];
  uVar6 = (uint)((ulong)uVar22 * 0x2fc9bebf);
  uVar5 = uVar6 + *l;
  uVar6 = l[1] + (uint)(uVar5 < uVar6) + (int)((ulong)uVar22 * 0x2fc9bebf >> 0x20);
  uVar32 = (ulong)uVar24 * 0x2fc9bebf + (ulong)uVar6;
  uVar7 = (uint)(uVar32 >> 0x20);
  uVar6 = uVar7 + (uVar6 < l[1]);
  lVar33 = (ulong)uVar22 * 0x402da173 + (uVar32 & 0xffffffff);
  uVar8 = (uint)lVar33;
  uVar9 = (uint)((ulong)lVar33 >> 0x20);
  uVar10 = uVar9 + uVar6;
  uVar11 = l[2] + uVar10;
  uVar16 = (uint)(uVar11 < l[2]);
  uVar6 = uVar16 + (uint)(uVar10 < uVar9) + (uint)(uVar6 < uVar7);
  uVar32 = (ulong)uVar25 * 0x2fc9bebf + (ulong)uVar11;
  uVar7 = (uint)(uVar32 >> 0x20);
  uVar9 = uVar7 + uVar6;
  uVar32 = (ulong)uVar24 * 0x402da173 + (uVar32 & 0xffffffff);
  uVar10 = (uint)(uVar32 >> 0x20);
  uVar11 = uVar10 + uVar9;
  lVar33 = (ulong)uVar22 * 0x50b75fc4 + (uVar32 & 0xffffffff);
  uVar12 = (uint)lVar33;
  uVar13 = (uint)((ulong)lVar33 >> 0x20);
  uVar14 = uVar13 + uVar11;
  uVar15 = l[3] + uVar14;
  uVar19 = (uint)(uVar15 < l[3]);
  uVar6 = uVar19 + (uint)(uVar14 < uVar13) +
                   (uint)(uVar11 < uVar10) + (uint)(uVar9 < uVar7) + (uint)(uVar6 < uVar16);
  uVar32 = (ulong)uVar26 * 0x2fc9bebf + (ulong)uVar15;
  uVar7 = (uint)(uVar32 >> 0x20);
  uVar9 = uVar7 + uVar6;
  uVar32 = (ulong)uVar25 * 0x402da173 + (uVar32 & 0xffffffff);
  uVar10 = (uint)(uVar32 >> 0x20);
  uVar11 = uVar10 + uVar9;
  uVar32 = (ulong)uVar24 * 0x50b75fc4 + (uVar32 & 0xffffffff);
  uVar16 = (uint)(uVar32 >> 0x20);
  uVar13 = uVar16 + uVar11;
  lVar33 = (ulong)uVar22 * 0x45512319 + (uVar32 & 0xffffffff);
  uVar14 = (uint)lVar33;
  uVar15 = (uint)((ulong)lVar33 >> 0x20);
  uVar17 = uVar15 + uVar13;
  uVar18 = l[4] + uVar17;
  uVar23 = (uint)(uVar18 < l[4]);
  uVar6 = uVar23 + (uint)(uVar17 < uVar15) +
                   (uint)(uVar13 < uVar16) +
                   (uint)(uVar11 < uVar10) + (uint)(uVar9 < uVar7) + (uint)(uVar6 < uVar19);
  uVar32 = (ulong)uVar27 * 0x2fc9bebf + (ulong)uVar18;
  uVar7 = (uint)(uVar32 >> 0x20);
  uVar9 = uVar7 + uVar6;
  uVar32 = (ulong)uVar26 * 0x402da173 + (uVar32 & 0xffffffff);
  uVar10 = (uint)(uVar32 >> 0x20);
  uVar11 = uVar10 + uVar9;
  uVar32 = (ulong)uVar25 * 0x50b75fc4 + (uVar32 & 0xffffffff);
  uVar16 = (uint)(uVar32 >> 0x20);
  uVar13 = uVar16 + uVar11;
  lVar33 = (ulong)uVar24 * 0x45512319 + (uVar32 & 0xffffffff);
  uVar15 = (uint)((ulong)lVar33 >> 0x20);
  uVar19 = uVar15 + uVar13;
  uVar17 = uVar22 + (int)lVar33;
  uVar18 = (uVar17 < uVar22) + uVar19;
  uVar20 = l[5] + uVar18;
  uVar21 = (uint)(uVar20 < l[5]);
  uVar22 = uVar21 + (uint)(uVar18 < (uVar17 < uVar22)) +
                    (uint)(uVar19 < uVar15) +
                    (uint)(uVar13 < uVar16) +
                    (uint)(uVar11 < uVar10) + (uint)(uVar9 < uVar7) + (uint)(uVar6 < uVar23);
  uVar32 = (ulong)uVar28 * 0x2fc9bebf + (ulong)uVar20;
  uVar6 = (uint)(uVar32 >> 0x20);
  uVar7 = uVar6 + uVar22;
  uVar32 = (ulong)uVar27 * 0x402da173 + (uVar32 & 0xffffffff);
  uVar9 = (uint)(uVar32 >> 0x20);
  uVar10 = uVar9 + uVar7;
  uVar32 = (ulong)uVar26 * 0x50b75fc4 + (uVar32 & 0xffffffff);
  uVar11 = (uint)(uVar32 >> 0x20);
  uVar16 = uVar11 + uVar10;
  lVar33 = (ulong)uVar25 * 0x45512319 + (uVar32 & 0xffffffff);
  uVar13 = (uint)((ulong)lVar33 >> 0x20);
  uVar15 = uVar13 + uVar16;
  uVar19 = uVar24 + (int)lVar33;
  uVar18 = (uVar19 < uVar24) + uVar15;
  uVar23 = l[6] + uVar18;
  uVar20 = (uint)(uVar23 < l[6]);
  uVar22 = uVar20 + (uint)(uVar18 < (uVar19 < uVar24)) +
                    (uint)(uVar15 < uVar13) +
                    (uint)(uVar16 < uVar11) +
                    (uint)(uVar10 < uVar9) + (uint)(uVar7 < uVar6) + (uint)(uVar22 < uVar21);
  uVar32 = (ulong)uVar29 * 0x2fc9bebf + (ulong)uVar23;
  uVar24 = (uint)(uVar32 >> 0x20);
  uVar6 = uVar24 + uVar22;
  uVar32 = (ulong)uVar28 * 0x402da173 + (uVar32 & 0xffffffff);
  uVar7 = (uint)(uVar32 >> 0x20);
  uVar9 = uVar7 + uVar6;
  uVar32 = (ulong)uVar27 * 0x50b75fc4 + (uVar32 & 0xffffffff);
  uVar10 = (uint)(uVar32 >> 0x20);
  uVar11 = uVar10 + uVar9;
  lVar33 = (ulong)uVar26 * 0x45512319 + (uVar32 & 0xffffffff);
  uVar16 = (uint)((ulong)lVar33 >> 0x20);
  uVar13 = uVar16 + uVar11;
  uVar15 = uVar25 + (int)lVar33;
  uVar18 = (uVar15 < uVar25) + uVar13;
  uVar23 = l[7] + uVar18;
  uVar21 = (uint)(uVar23 < l[7]);
  uVar22 = uVar21 + (uint)(uVar18 < (uVar15 < uVar25)) +
                    (uint)(uVar13 < uVar16) +
                    (uint)(uVar11 < uVar10) +
                    (uint)(uVar9 < uVar7) + (uint)(uVar6 < uVar24) + (uint)(uVar22 < uVar20);
  uVar32 = (ulong)uVar30 * 0x2fc9bebf + (ulong)uVar23;
  uVar24 = (uint)(uVar32 >> 0x20);
  uVar25 = uVar24 + uVar22;
  uVar32 = (ulong)uVar29 * 0x402da173 + (uVar32 & 0xffffffff);
  uVar6 = (uint)(uVar32 >> 0x20);
  uVar7 = uVar6 + uVar25;
  uVar32 = (ulong)uVar28 * 0x50b75fc4 + (uVar32 & 0xffffffff);
  uVar9 = (uint)(uVar32 >> 0x20);
  uVar10 = uVar9 + uVar7;
  lVar33 = (ulong)uVar27 * 0x45512319 + (uVar32 & 0xffffffff);
  uVar11 = (uint)((ulong)lVar33 >> 0x20);
  uVar16 = uVar11 + uVar10;
  uVar13 = uVar26 + (int)lVar33;
  uVar18 = (uVar13 < uVar26) + uVar16;
  uVar32 = (ulong)uVar30 * 0x402da173 + (ulong)uVar18;
  uVar23 = (uint)(uVar32 >> 0x20);
  uVar22 = uVar23 + (uint)(uVar18 < (uVar13 < uVar26)) +
                    (uint)(uVar16 < uVar11) +
                    (uint)(uVar10 < uVar9) +
                    (uint)(uVar7 < uVar6) + (uint)(uVar25 < uVar24) + (uint)(uVar22 < uVar21);
  uVar32 = (ulong)uVar29 * 0x50b75fc4 + (uVar32 & 0xffffffff);
  uVar24 = (uint)(uVar32 >> 0x20);
  uVar25 = uVar24 + uVar22;
  lVar33 = (ulong)uVar28 * 0x45512319 + (uVar32 & 0xffffffff);
  uVar26 = (uint)((ulong)lVar33 >> 0x20);
  uVar6 = uVar26 + uVar25;
  uVar7 = uVar27 + (int)lVar33;
  uVar9 = (uVar7 < uVar27) + uVar6;
  uVar32 = (ulong)uVar30 * 0x50b75fc4 + (ulong)uVar9;
  uVar10 = (uint)(uVar32 >> 0x20);
  uVar22 = uVar10 + (uint)(uVar9 < (uVar7 < uVar27)) +
                    (uint)(uVar6 < uVar26) + (uint)(uVar25 < uVar24) + (uint)(uVar22 < uVar23);
  lVar33 = (ulong)uVar29 * 0x45512319 + (uVar32 & 0xffffffff);
  uVar24 = (uint)((ulong)lVar33 >> 0x20);
  uVar25 = uVar24 + uVar22;
  uVar26 = uVar28 + (int)lVar33;
  uVar27 = (uVar26 < uVar28) + uVar25;
  lVar33 = (ulong)uVar30 * 0x45512319 + (ulong)uVar27;
  uVar6 = (uint)((ulong)lVar33 >> 0x20);
  uVar22 = uVar6 + (uint)(uVar27 < (uVar26 < uVar28)) +
                   (uint)(uVar25 < uVar24) + (uint)(uVar22 < uVar10);
  uVar24 = uVar29 + (int)lVar33;
  uVar25 = (uVar24 < uVar29) + uVar22;
  uVar27 = uVar30 + uVar25;
  uVar22 = (uint)(uVar27 < uVar30) + (uint)(uVar25 < (uVar24 < uVar29)) + (uint)(uVar22 < uVar6);
  uVar32 = (ulong)uVar7 * 0x2fc9bebf + CONCAT44(uVar8,uVar5);
  uVar25 = (uint)(uVar32 >> 0x20);
  uVar1 = (ulong)uVar26 * 0x2fc9bebf + (ulong)uVar25;
  uVar28 = (uint)(uVar1 >> 0x20);
  uVar25 = uVar28 + (uVar25 < uVar8);
  uVar1 = (ulong)uVar7 * 0x402da173 + (uVar1 & 0xffffffff);
  uVar29 = (uint)(uVar1 >> 0x20);
  uVar30 = uVar29 + uVar25;
  uVar6 = uVar12 + uVar30;
  uVar5 = (uint)(uVar6 < uVar12);
  uVar25 = uVar5 + (uint)(uVar30 < uVar29) + (uint)(uVar25 < uVar28);
  uVar2 = (ulong)uVar24 * 0x2fc9bebf + (ulong)uVar6;
  uVar28 = (uint)(uVar2 >> 0x20);
  uVar29 = uVar28 + uVar25;
  uVar2 = (ulong)uVar26 * 0x402da173 + (uVar2 & 0xffffffff);
  uVar30 = (uint)(uVar2 >> 0x20);
  uVar6 = uVar30 + uVar29;
  uVar2 = (ulong)uVar7 * 0x50b75fc4 + (uVar2 & 0xffffffff);
  uVar8 = (uint)(uVar2 >> 0x20);
  uVar9 = uVar8 + uVar6;
  uVar10 = uVar14 + uVar9;
  uVar11 = (uint)(uVar10 < uVar14);
  uVar25 = uVar11 + (uint)(uVar9 < uVar8) +
                    (uint)(uVar6 < uVar30) + (uint)(uVar29 < uVar28) + (uint)(uVar25 < uVar5);
  uVar3 = (ulong)uVar27 * 0x2fc9bebf + (ulong)uVar10;
  uVar28 = (uint)(uVar3 >> 0x20);
  uVar29 = uVar28 + uVar25;
  uVar3 = (ulong)uVar24 * 0x402da173 + (uVar3 & 0xffffffff);
  uVar30 = (uint)(uVar3 >> 0x20);
  uVar6 = uVar30 + uVar29;
  uVar3 = (ulong)uVar26 * 0x50b75fc4 + (uVar3 & 0xffffffff);
  uVar5 = (uint)(uVar3 >> 0x20);
  uVar8 = uVar5 + uVar6;
  uVar3 = (ulong)uVar7 * 0x45512319 + (uVar3 & 0xffffffff);
  uVar9 = (uint)(uVar3 >> 0x20);
  uVar10 = uVar9 + uVar8;
  uVar16 = uVar17 + uVar10;
  uVar12 = (uint)(uVar16 < uVar17);
  uVar25 = uVar12 + (uint)(uVar10 < uVar9) +
                    (uint)(uVar8 < uVar5) +
                    (uint)(uVar6 < uVar30) + (uint)(uVar29 < uVar28) + (uint)(uVar25 < uVar11);
  uVar4 = (ulong)uVar22 * 0x2fc9bebf + (ulong)uVar16;
  uVar28 = (uint)(uVar4 >> 0x20);
  uVar29 = uVar28 + uVar25;
  uVar4 = (ulong)uVar27 * 0x402da173 + (uVar4 & 0xffffffff);
  uVar30 = (uint)(uVar4 >> 0x20);
  uVar6 = uVar30 + uVar29;
  uVar4 = (ulong)uVar24 * 0x50b75fc4 + (uVar4 & 0xffffffff);
  uVar5 = (uint)(uVar4 >> 0x20);
  uVar8 = uVar5 + uVar6;
  lVar33 = (ulong)uVar26 * 0x45512319 + (uVar4 & 0xffffffff);
  uVar9 = (uint)((ulong)lVar33 >> 0x20);
  uVar10 = uVar9 + uVar8;
  uVar11 = uVar7 + (int)lVar33;
  uVar7 = (uint)(uVar11 < uVar7);
  uVar16 = uVar7 + uVar10;
  uVar14 = uVar19 + uVar16;
  uVar19 = (uint)(uVar14 < uVar19);
  uVar25 = uVar19 + (uint)(uVar16 < uVar7) +
                    (uint)(uVar10 < uVar9) +
                    (uint)(uVar8 < uVar5) +
                    (uint)(uVar6 < uVar30) + (uint)(uVar29 < uVar28) + (uint)(uVar25 < uVar12);
  uVar4 = (ulong)uVar22 * 0x402da173 + (ulong)uVar14;
  uVar28 = (uint)(uVar4 >> 0x20);
  uVar29 = uVar28 + uVar25;
  uVar4 = (ulong)uVar27 * 0x50b75fc4 + (uVar4 & 0xffffffff);
  uVar30 = (uint)(uVar4 >> 0x20);
  uVar6 = uVar30 + uVar29;
  lVar33 = (ulong)uVar24 * 0x45512319 + (uVar4 & 0xffffffff);
  uVar5 = (uint)((ulong)lVar33 >> 0x20);
  uVar7 = uVar5 + uVar6;
  uVar8 = uVar26 + (int)lVar33;
  uVar26 = (uint)(uVar8 < uVar26);
  uVar9 = uVar26 + uVar7;
  uVar10 = uVar15 + uVar9;
  uVar16 = (uint)(uVar10 < uVar15);
  uVar25 = uVar16 + (uint)(uVar9 < uVar26) +
                    (uint)(uVar7 < uVar5) +
                    (uint)(uVar6 < uVar30) + (uint)(uVar29 < uVar28) + (uint)(uVar25 < uVar19);
  uVar4 = (ulong)uVar22 * 0x50b75fc4 + (ulong)uVar10;
  uVar26 = (uint)(uVar4 >> 0x20);
  uVar28 = uVar26 + uVar25;
  lVar33 = (ulong)uVar27 * 0x45512319 + (uVar4 & 0xffffffff);
  uVar29 = (uint)((ulong)lVar33 >> 0x20);
  uVar30 = uVar29 + uVar28;
  uVar6 = uVar24 + (int)lVar33;
  uVar24 = (uint)(uVar6 < uVar24);
  uVar5 = uVar24 + uVar30;
  uVar7 = uVar13 + uVar5;
  uVar4 = (ulong)uVar22 * 0x45512319 +
          CONCAT44((uint)(uVar7 < uVar13) +
                   (uint)(uVar5 < uVar24) +
                   (uint)(uVar30 < uVar29) + (uint)(uVar28 < uVar26) + (uint)(uVar25 < uVar16),uVar7
                  ) + CONCAT44(uVar22,uVar27);
  uVar22 = (uint)(uVar4 >> 0x20);
  uVar32 = (uVar32 & 0xffffffff) + (ulong)uVar22 * 0x2fc9bebf;
  r->d[0] = (uint32_t)uVar32;
  uVar32 = (uVar1 & 0xffffffff) + (ulong)uVar22 * 0x402da173 + (uVar32 >> 0x20);
  r->d[1] = (uint32_t)uVar32;
  uVar32 = (uVar2 & 0xffffffff) + (ulong)uVar22 * 0x50b75fc4 + (uVar32 >> 0x20);
  r->d[2] = (uint32_t)uVar32;
  uVar32 = (uVar3 & 0xffffffff) + (ulong)uVar22 * 0x45512319 + (uVar32 >> 0x20);
  r->d[3] = (uint32_t)uVar32;
  uVar32 = (ulong)uVar11 + (ulong)uVar22 + (uVar32 >> 0x20);
  r->d[4] = (uint32_t)uVar32;
  uVar32 = (ulong)uVar8 + (uVar32 >> 0x20);
  r->d[5] = (uint32_t)uVar32;
  uVar32 = (ulong)uVar6 + (uVar32 >> 0x20);
  r->d[6] = (uint32_t)uVar32;
  lVar33 = (uVar4 & 0xffffffff) + (uVar32 >> 0x20);
  r->d[7] = (uint32_t)lVar33;
  iVar31 = secp256k1_scalar_check_overflow(r);
  secp256k1_scalar_reduce(r,(int)((ulong)lVar33 >> 0x20) + iVar31);
  return;
}

Assistant:

static void secp256k1_scalar_reduce_512(secp256k1_scalar *r, const uint32_t *l) {
    uint64_t c;
    uint32_t n0 = l[8], n1 = l[9], n2 = l[10], n3 = l[11], n4 = l[12], n5 = l[13], n6 = l[14], n7 = l[15];
    uint32_t m0, m1, m2, m3, m4, m5, m6, m7, m8, m9, m10, m11, m12;
    uint32_t p0, p1, p2, p3, p4, p5, p6, p7, p8;

    /* 96 bit accumulator. */
    uint32_t c0, c1, c2;

    /* Reduce 512 bits into 385. */
    /* m[0..12] = l[0..7] + n[0..7] * SECP256K1_N_C. */
    c0 = l[0]; c1 = 0; c2 = 0;
    muladd_fast(n0, SECP256K1_N_C_0);
    extract_fast(m0);
    sumadd_fast(l[1]);
    muladd(n1, SECP256K1_N_C_0);
    muladd(n0, SECP256K1_N_C_1);
    extract(m1);
    sumadd(l[2]);
    muladd(n2, SECP256K1_N_C_0);
    muladd(n1, SECP256K1_N_C_1);
    muladd(n0, SECP256K1_N_C_2);
    extract(m2);
    sumadd(l[3]);
    muladd(n3, SECP256K1_N_C_0);
    muladd(n2, SECP256K1_N_C_1);
    muladd(n1, SECP256K1_N_C_2);
    muladd(n0, SECP256K1_N_C_3);
    extract(m3);
    sumadd(l[4]);
    muladd(n4, SECP256K1_N_C_0);
    muladd(n3, SECP256K1_N_C_1);
    muladd(n2, SECP256K1_N_C_2);
    muladd(n1, SECP256K1_N_C_3);
    sumadd(n0);
    extract(m4);
    sumadd(l[5]);
    muladd(n5, SECP256K1_N_C_0);
    muladd(n4, SECP256K1_N_C_1);
    muladd(n3, SECP256K1_N_C_2);
    muladd(n2, SECP256K1_N_C_3);
    sumadd(n1);
    extract(m5);
    sumadd(l[6]);
    muladd(n6, SECP256K1_N_C_0);
    muladd(n5, SECP256K1_N_C_1);
    muladd(n4, SECP256K1_N_C_2);
    muladd(n3, SECP256K1_N_C_3);
    sumadd(n2);
    extract(m6);
    sumadd(l[7]);
    muladd(n7, SECP256K1_N_C_0);
    muladd(n6, SECP256K1_N_C_1);
    muladd(n5, SECP256K1_N_C_2);
    muladd(n4, SECP256K1_N_C_3);
    sumadd(n3);
    extract(m7);
    muladd(n7, SECP256K1_N_C_1);
    muladd(n6, SECP256K1_N_C_2);
    muladd(n5, SECP256K1_N_C_3);
    sumadd(n4);
    extract(m8);
    muladd(n7, SECP256K1_N_C_2);
    muladd(n6, SECP256K1_N_C_3);
    sumadd(n5);
    extract(m9);
    muladd(n7, SECP256K1_N_C_3);
    sumadd(n6);
    extract(m10);
    sumadd_fast(n7);
    extract_fast(m11);
    VERIFY_CHECK(c0 <= 1);
    m12 = c0;

    /* Reduce 385 bits into 258. */
    /* p[0..8] = m[0..7] + m[8..12] * SECP256K1_N_C. */
    c0 = m0; c1 = 0; c2 = 0;
    muladd_fast(m8, SECP256K1_N_C_0);
    extract_fast(p0);
    sumadd_fast(m1);
    muladd(m9, SECP256K1_N_C_0);
    muladd(m8, SECP256K1_N_C_1);
    extract(p1);
    sumadd(m2);
    muladd(m10, SECP256K1_N_C_0);
    muladd(m9, SECP256K1_N_C_1);
    muladd(m8, SECP256K1_N_C_2);
    extract(p2);
    sumadd(m3);
    muladd(m11, SECP256K1_N_C_0);
    muladd(m10, SECP256K1_N_C_1);
    muladd(m9, SECP256K1_N_C_2);
    muladd(m8, SECP256K1_N_C_3);
    extract(p3);
    sumadd(m4);
    muladd(m12, SECP256K1_N_C_0);
    muladd(m11, SECP256K1_N_C_1);
    muladd(m10, SECP256K1_N_C_2);
    muladd(m9, SECP256K1_N_C_3);
    sumadd(m8);
    extract(p4);
    sumadd(m5);
    muladd(m12, SECP256K1_N_C_1);
    muladd(m11, SECP256K1_N_C_2);
    muladd(m10, SECP256K1_N_C_3);
    sumadd(m9);
    extract(p5);
    sumadd(m6);
    muladd(m12, SECP256K1_N_C_2);
    muladd(m11, SECP256K1_N_C_3);
    sumadd(m10);
    extract(p6);
    sumadd_fast(m7);
    muladd_fast(m12, SECP256K1_N_C_3);
    sumadd_fast(m11);
    extract_fast(p7);
    p8 = c0 + m12;
    VERIFY_CHECK(p8 <= 2);

    /* Reduce 258 bits into 256. */
    /* r[0..7] = p[0..7] + p[8] * SECP256K1_N_C. */
    c = p0 + (uint64_t)SECP256K1_N_C_0 * p8;
    r->d[0] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p1 + (uint64_t)SECP256K1_N_C_1 * p8;
    r->d[1] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p2 + (uint64_t)SECP256K1_N_C_2 * p8;
    r->d[2] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p3 + (uint64_t)SECP256K1_N_C_3 * p8;
    r->d[3] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p4 + (uint64_t)p8;
    r->d[4] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p5;
    r->d[5] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p6;
    r->d[6] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p7;
    r->d[7] = c & 0xFFFFFFFFUL; c >>= 32;

    /* Final reduction of r. */
    secp256k1_scalar_reduce(r, c + secp256k1_scalar_check_overflow(r));
}